

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

bool __thiscall Minisat::Solver::litRedundant(Solver *this,Lit p)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  ShrinkStackElem *pSVar5;
  VarData *pVVar6;
  bool bVar7;
  uint uVar8;
  long lVar10;
  uint *puVar11;
  int iVar12;
  long lVar13;
  Lit local_4c;
  ShrinkStackElem local_48;
  vec<Minisat::Solver::ShrinkStackElem,_int> *local_40;
  vec<Minisat::Lit,_int> *local_38;
  uint32_t uVar9;
  
  iVar12 = p.x >> 1;
  local_4c.x = p.x;
  if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar12) {
LAB_00109b54:
    __assert_fail("has(k)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                  ,0x28,
                  "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
                 );
  }
  if (1 < (byte)(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar12]
     ) {
    __assert_fail("seen[var(p)] == seen_undef || seen[var(p)] == seen_source",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                  ,0x187,"bool Minisat::Solver::litRedundant(Lit)");
  }
  if ((this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map
      .sz <= iVar12) {
LAB_00109b73:
    __assert_fail("has(k)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                  ,0x27,
                  "const V &Minisat::IntMap<int, Minisat::Solver::VarData>::operator[](K) const [K = int, V = Minisat::Solver::VarData, MkIndex = Minisat::MkIndexDefault<int>]"
                 );
  }
  uVar8 = (this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>
          .map.data[iVar12].reason;
  if ((ulong)uVar8 == 0xffffffff) {
    __assert_fail("reason(var(p)) != CRef_Undef",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                  ,0x188,"bool Minisat::Solver::litRedundant(Lit)");
  }
  if ((this->ca).ra.sz <= uVar8) {
LAB_00109b92:
    __assert_fail("r < sz",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                  ,0x3f,
                  "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]");
  }
  if ((this->analyze_stack).data != (ShrinkStackElem *)0x0) {
    (this->analyze_stack).sz = 0;
  }
  puVar11 = (this->ca).ra.memory + uVar8;
  local_40 = &this->analyze_stack;
  local_38 = &this->analyze_toclear;
  uVar8 = 1;
  do {
    uVar2 = *puVar11;
    if (uVar8 < uVar2 >> 5) {
      uVar3 = puVar11[(long)(int)uVar8 + 1];
      iVar12 = (int)uVar3 >> 1;
      if ((this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>
          .map.sz <= iVar12) goto LAB_00109b73;
      pVVar6 = (this->vardata).
               super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data;
      bVar7 = false;
      uVar9 = uVar8;
      if (pVVar6[iVar12].level != 0) {
        if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar12)
        goto LAB_00109b54;
        cVar1 = (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar12]
        ;
        if ((byte)(cVar1 - 1U) < 2) {
          bVar7 = false;
        }
        else if ((cVar1 == '\x03') || (pVVar6[iVar12].reason == 0xffffffff)) {
          local_48.i = 0;
          local_48.l.x = local_4c.x;
          vec<Minisat::Solver::ShrinkStackElem,_int>::push(local_40,&local_48);
          bVar7 = true;
          if (0 < (this->analyze_stack).sz) {
            lVar10 = 4;
            lVar13 = 0;
            do {
              iVar12 = *(int *)((long)&((this->analyze_stack).data)->i + lVar10) >> 1;
              if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <=
                  iVar12) goto LAB_00109b54;
              pcVar4 = (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
              if (pcVar4[iVar12] == '\0') {
                pcVar4[iVar12] = '\x03';
                vec<Minisat::Lit,_int>::push(local_38,(Lit *)((long)&local_40->data->i + lVar10));
              }
              lVar13 = lVar13 + 1;
              lVar10 = lVar10 + 8;
            } while (lVar13 < (this->analyze_stack).sz);
            bVar7 = true;
          }
        }
        else {
          local_48.l.x = local_4c.x;
          local_48.i = uVar8;
          vec<Minisat::Solver::ShrinkStackElem,_int>::push(local_40,&local_48);
          local_4c.x = uVar3;
          if ((this->vardata).
              super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz <=
              iVar12) goto LAB_00109b73;
          uVar3 = (this->vardata).
                  super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.
                  data[iVar12].reason;
          if ((this->ca).ra.sz <= uVar3) goto LAB_00109b92;
          puVar11 = (this->ca).ra.memory + uVar3;
          bVar7 = false;
          uVar9 = 0;
        }
      }
      if (bVar7) goto LAB_00109b3f;
    }
    else {
      iVar12 = local_4c.x >> 1;
      if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar12)
      goto LAB_00109b54;
      pcVar4 = (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
      if (pcVar4[iVar12] == '\0') {
        pcVar4[iVar12] = '\x02';
        vec<Minisat::Lit,_int>::push(local_38,&local_4c);
      }
      iVar12 = (this->analyze_stack).sz;
      lVar10 = (long)iVar12;
      if (lVar10 == 0) {
LAB_00109b3f:
        return uVar2 >> 5 <= uVar8;
      }
      pSVar5 = (this->analyze_stack).data;
      uVar9 = pSVar5[lVar10 + -1].i;
      local_4c.x = pSVar5[lVar10 + -1].l.x;
      if ((this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>
          .map.sz <= local_4c.x >> 1) goto LAB_00109b73;
      uVar8 = (this->vardata).
              super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data
              [local_4c.x >> 1].reason;
      if ((this->ca).ra.sz <= uVar8) goto LAB_00109b92;
      if (iVar12 < 1) {
        __assert_fail("sz > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Vec.h"
                      ,0x4e,
                      "void Minisat::vec<Minisat::Solver::ShrinkStackElem>::pop() [T = Minisat::Solver::ShrinkStackElem, _Size = int]"
                     );
      }
      puVar11 = (this->ca).ra.memory + uVar8;
      (this->analyze_stack).sz = iVar12 + -1;
    }
    uVar8 = uVar9 + 1;
  } while( true );
}

Assistant:

bool Solver::litRedundant(Lit p)
{
    enum { seen_undef = 0, seen_source = 1, seen_removable = 2, seen_failed = 3 };
    assert(seen[var(p)] == seen_undef || seen[var(p)] == seen_source);
    assert(reason(var(p)) != CRef_Undef);

    Clause*               c     = &ca[reason(var(p))];
    vec<ShrinkStackElem>& stack = analyze_stack;
    stack.clear();

    for (uint32_t i = 1; ; i++){
        if (i < (uint32_t)c->size()){
            // Checking 'p'-parents 'l':
            Lit l = (*c)[i];
            
            // Variable at level 0 or previously removable:
            if (level(var(l)) == 0 || seen[var(l)] == seen_source || seen[var(l)] == seen_removable){
                continue; }
            
            // Check variable can not be removed for some local reason:
            if (reason(var(l)) == CRef_Undef || seen[var(l)] == seen_failed){
                stack.push(ShrinkStackElem(0, p));
                for (int i = 0; i < stack.size(); i++)
                    if (seen[var(stack[i].l)] == seen_undef){
                        seen[var(stack[i].l)] = seen_failed;
                        analyze_toclear.push(stack[i].l);
                    }
                    
                return false;
            }

            // Recursively check 'l':
            stack.push(ShrinkStackElem(i, p));
            i  = 0;
            p  = l;
            c  = &ca[reason(var(p))];
        }else{
            // Finished with current element 'p' and reason 'c':
            if (seen[var(p)] == seen_undef){
                seen[var(p)] = seen_removable;
                analyze_toclear.push(p);
            }

            // Terminate with success if stack is empty:
            if (stack.size() == 0) break;
            
            // Continue with top element on stack:
            i  = stack.last().i;
            p  = stack.last().l;
            c  = &ca[reason(var(p))];

            stack.pop();
        }
    }

    return true;
}